

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void crec_copy(jit_State *J,TRef trdst,TRef trsrc,TRef trlen,CType *ct)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  CTSize CVar4;
  CTState *cts;
  CType *pCVar5;
  IRType IVar6;
  IRType IVar7;
  TRef TVar8;
  TRef TVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  IRType IVar13;
  IRType *pIVar14;
  ulong uVar15;
  long lVar16;
  IRType IVar17;
  uint uVar18;
  TRef *pTVar19;
  uint uVar20;
  bool bVar21;
  CRecMemList ml [16];
  CTSize local_138;
  IRType local_134;
  TRef local_130 [64];
  
  if (-1 < (short)trlen) {
    IVar7 = (J->cur).ir[trlen & 0x7fff].field_1.op12;
    if (IVar7 == IRT_NIL) {
      return;
    }
    if (IVar7 < (IRT_GUARD|IRT_FALSE)) {
      IVar17 = IRT_U64;
      uVar20 = 8;
      IVar13 = IRT_NIL;
      if (ct == (CType *)0x0) {
LAB_0015d18c:
        bVar21 = false;
LAB_0015d1ac:
        uVar15 = 0;
        do {
          if (uVar20 + IVar13 <= IVar7) {
            uVar11 = uVar15;
            if ((uint)uVar15 < 0x11) {
              uVar11 = 0x10;
            }
            pIVar14 = &local_134 + uVar15 * 4;
            lVar16 = 0;
            do {
              if (uVar15 - uVar11 == lVar16) goto LAB_0015cfc3;
              pIVar14[-1] = IVar13;
              *pIVar14 = IVar17;
              lVar16 = lVar16 + -1;
              pIVar14 = pIVar14 + 4;
              IVar13 = IVar13 + uVar20;
            } while (uVar20 + IVar13 <= IVar7);
            uVar15 = (ulong)((uint)uVar15 - (int)lVar16);
          }
          uVar20 = uVar20 >> 1;
          IVar17 = IVar17 - IRT_TRUE;
        } while (IVar13 < IVar7);
      }
      else {
        cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
        uVar10 = ct->info;
        if ((uVar10 & 0xf0000000) == 0x30000000) {
          IVar6 = crec_ct2irt(cts,cts->tab + (uVar10 & 0xffff));
          bVar21 = IVar6 != IRT_CDATA;
          if (bVar21) {
            uVar20 = (uint)"\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                           [IVar6];
            IVar17 = IVar6;
          }
          goto LAB_0015d1ac;
        }
        if ((uVar10 >> 0x17 & 1) != 0) goto LAB_0015d18c;
        if (ct->sib == 0) goto LAB_0015cfc3;
        pCVar5 = cts->tab;
        uVar15 = 0;
        uVar2 = ct->sib;
        do {
          uVar3 = pCVar5[uVar2].sib;
          uVar20 = pCVar5[uVar2].info >> 0x1c;
          if (uVar20 != 0xb) {
            if (uVar20 != 9) goto LAB_0015cfc3;
            if (pCVar5[uVar2].name.gcptr64 != 0) {
              uVar10 = pCVar5[uVar2].info & 0xffff;
              uVar20 = pCVar5[uVar10].info;
              IVar7 = crec_ct2irt(cts,pCVar5 + uVar10);
              if ((IVar7 == IRT_CDATA) || (uVar18 = (uint)uVar15, 0xf < uVar18)) goto LAB_0015cfc3;
              CVar4 = pCVar5[uVar2].size;
              (&local_138)[uVar15 * 4] = CVar4;
              (&local_134)[uVar15 * 4] = IVar7;
              uVar12 = uVar18 + 1;
              if ((uVar20 & 0xf4000000) == 0x34000000) {
                if (uVar18 == 0xf) goto LAB_0015cfc3;
                (&local_138)[(ulong)uVar12 * 4] = (pCVar5[uVar10].size >> 1) + CVar4;
                (&local_134)[(ulong)uVar12 * 4] = IVar7;
                uVar15 = (ulong)(uVar18 + 2);
              }
              else {
                uVar15 = (ulong)uVar12;
              }
            }
          }
          uVar2 = uVar3;
        } while (uVar3 != 0);
        bVar21 = true;
      }
      if ((int)uVar15 != 0) {
        uVar18 = 1;
        uVar20 = 0;
        uVar10 = 0;
        uVar11 = 0;
        do {
          TVar8 = lj_ir_kint64(J,(ulong)(&local_138)[uVar11 * 4]);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = (IRRef1)trsrc;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
          TVar9 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = (ushort)(&local_134)[uVar11 * 4] | 0x4600;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = 0;
          TVar9 = lj_opt_fold(J);
          local_130[uVar11 * 4 + 1] = TVar9;
          local_130[uVar11 * 4] = TVar8;
          uVar1 = uVar11 + 1;
          uVar10 = uVar10 + 1;
          if ((3 < uVar10) || (uVar15 <= uVar1)) {
            uVar10 = 0;
            if (uVar20 <= uVar11) {
              pTVar19 = local_130 + (ulong)uVar20 * 4 + 1;
              do {
                TVar8 = pTVar19[0xffffffffffffffff];
                (J->fold).ins.field_0.ot = 0x2909;
                (J->fold).ins.field_0.op1 = (IRRef1)trdst;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
                TVar9 = lj_opt_fold(J);
                TVar8 = *pTVar19;
                (J->fold).ins.field_0.ot = (ushort)pTVar19[0xfffffffffffffffe] | 0x4e00;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
                lj_opt_fold(J);
                uVar20 = uVar20 + 1;
                pTVar19 = pTVar19 + 4;
              } while (uVar18 != uVar20);
              uVar10 = 0;
              uVar20 = uVar18;
            }
          }
          uVar18 = uVar18 + 1;
          uVar11 = uVar1;
        } while (uVar1 != uVar15);
        if (bVar21) {
          return;
        }
        goto LAB_0015cfd8;
      }
    }
  }
LAB_0015cfc3:
  lj_ir_call(J,IRCALL_memcpy,(ulong)trdst,(ulong)trsrc,(ulong)trlen);
LAB_0015cfd8:
  (J->fold).ins.field_0.ot = 0x5a00;
  (J->fold).ins.field_1.op12 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

static void crec_copy(jit_State *J, TRef trdst, TRef trsrc, TRef trlen,
		      CType *ct)
{
  if (tref_isk(trlen)) {  /* Length must be constant. */
    CRecMemList ml[CREC_COPY_MAXUNROLL];
    MSize mlp = 0;
    CTSize step = 1, len = (CTSize)IR(tref_ref(trlen))->i;
    IRType tp = IRT_CDATA;
    int needxbar = 0;
    if (len == 0) return;  /* Shortcut. */
    if (len > CREC_COPY_MAXLEN) goto fallback;
    if (ct) {
      CTState *cts = ctype_ctsG(J2G(J));
      lj_assertJ(ctype_isarray(ct->info) || ctype_isstruct(ct->info),
		 "copy of non-aggregate");
      if (ctype_isarray(ct->info)) {
	CType *cct = ctype_rawchild(cts, ct);
	tp = crec_ct2irt(cts, cct);
	if (tp == IRT_CDATA) goto rawcopy;
	step = lj_ir_type_size[tp];
	lj_assertJ((len & (step-1)) == 0, "copy of fractional size");
      } else if ((ct->info & CTF_UNION)) {
	step = (1u << ctype_align(ct->info));
	goto rawcopy;
      } else {
	mlp = crec_copy_struct(ml, cts, ct);
	goto emitcopy;
      }
    } else {
    rawcopy:
      needxbar = 1;
      if (LJ_TARGET_UNALIGNED || step >= CTSIZE_PTR)
	step = CTSIZE_PTR;
    }
    mlp = crec_copy_unroll(ml, len, step, tp);
  emitcopy:
    if (mlp) {
      crec_copy_emit(J, ml, mlp, trdst, trsrc);
      if (needxbar)
	emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
      return;
    }
  }
fallback:
  /* Call memcpy. Always needs a barrier to disable alias analysis. */
  lj_ir_call(J, IRCALL_memcpy, trdst, trsrc, trlen);
  emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
}